

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O2

void __thiscall duckdb::PatasScanState<double>::SkipGroup(PatasScanState<double> *this)

{
  ulong uVar1;
  
  uVar1 = this->count - this->total_value_count;
  if (0x3ff < uVar1) {
    uVar1 = 0x400;
  }
  this->metadata_ptr = this->metadata_ptr + (-4 - (ulong)(uint)((int)uVar1 * 2));
  this->total_value_count = uVar1 + this->total_value_count;
  return;
}

Assistant:

void SkipGroup() {
		// Skip the offset indicating where the data starts
		metadata_ptr -= sizeof(uint32_t);
		idx_t group_size = MinValue((idx_t)PatasPrimitives::PATAS_GROUP_SIZE, count - total_value_count);
		// Skip the blocks of packed data
		metadata_ptr -= sizeof(uint16_t) * group_size;

		total_value_count += group_size;
	}